

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O1

void api_suite::api_begin(void)

{
  segment sVar1;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  type local_48 [4];
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_38.member.cap = 4;
  local_38.member.size = 0;
  local_38.member.next = 4;
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_38);
  boost::detail::test_impl
            ("first.begin() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x8c,"void api_suite::api_begin()",sVar1.member.head == (pointer)0x0);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_38);
  boost::detail::test_impl
            ("cfirst.begin() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x8e,"void api_suite::api_begin()",sVar1.member.head == (pointer)0x0);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_38);
  boost::detail::test_impl
            ("last.begin() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x90,"void api_suite::api_begin()",sVar1.member.head == (pointer)0x0);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_38);
  boost::detail::test_impl
            ("clast.begin() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x92,"void api_suite::api_begin()",sVar1.member.head == (pointer)0x0);
  return;
}

Assistant:

void api_begin()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto first = span.first_segment();
        BOOST_TEST(first.begin() == nullptr);
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.begin() == nullptr);
        auto last = span.last_segment();
        BOOST_TEST(last.begin() == nullptr);
        const auto clast = span.last_segment();
        BOOST_TEST(clast.begin() == nullptr);
    }
}